

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServerBase::OnDisconnect(cmServerBase *this,cmConnection *pConnection)

{
  bool bVar1;
  size_t in_RCX;
  void *__buf;
  int __fd;
  int in_R8D;
  __normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
  local_58;
  const_iterator local_50;
  cmConnection *local_48;
  unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *local_40;
  __normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
  local_38;
  __normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
  local_30;
  const_iterator local_28;
  anon_class_8_1_7e3579ce_for__M_pred local_20;
  anon_class_8_1_7e3579ce_for__M_pred pred;
  cmConnection *pConnection_local;
  cmServerBase *this_local;
  
  local_20.pConnection = pConnection;
  pred.pConnection = pConnection;
  uv_rwlock_wrlock(&this->ConnectionsMutex);
  local_38._M_current =
       (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)
       std::
       vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
       ::begin(&this->Connections);
  local_40 = (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)
             std::
             vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
             ::end(&this->Connections);
  local_48 = local_20.pConnection;
  local_30 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>*,std::vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>>,cmServerBase::OnDisconnect(cmConnection*)::__0>
                       (local_38,(__normal_iterator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_*,_std::vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>_>
                                  )local_40,local_20);
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>const*,std::vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>>
  ::__normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>*>
            ((__normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>const*,std::vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>>
              *)&local_28,&local_30);
  local_58._M_current =
       (unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *)
       std::
       vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
       ::end(&this->Connections);
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>const*,std::vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>>
  ::__normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>*>
            ((__normal_iterator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>const*,std::vector<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>,std::allocator<std::unique_ptr<cmConnection,std::default_delete<cmConnection>>>>>
              *)&local_50,&local_58);
  std::
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ::erase(&this->Connections,local_28,local_50);
  __fd = (int)local_28._M_current;
  uv_rwlock_wrunlock(&this->ConnectionsMutex);
  bVar1 = std::
          vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
          ::empty(&this->Connections);
  if (bVar1) {
    auto_async_t::send(&this->ShutdownSignal,__fd,__buf,in_RCX,in_R8D);
  }
  return;
}

Assistant:

void cmServerBase::OnDisconnect(cmConnection* pConnection)
{
  auto pred = [pConnection](const std::unique_ptr<cmConnection>& m) {
    return m.get() == pConnection;
  };
  uv_rwlock_wrlock(&ConnectionsMutex);
  Connections.erase(
    std::remove_if(Connections.begin(), Connections.end(), pred),
    Connections.end());
  uv_rwlock_wrunlock(&ConnectionsMutex);
  if (Connections.empty()) {
    this->ShutdownSignal.send();
  }
}